

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c++
# Opt level: O3

uint __thiscall kj::_::HashCoder::operator*(HashCoder *this,ArrayPtr<const_unsigned_char> s)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint h;
  ulong uVar4;
  byte *pbVar5;
  
  uVar4 = s.size_;
  pbVar5 = s.ptr;
  uVar1 = (uint)s.size_;
  uVar3 = uVar4 & 0xffffffff;
  do {
    uVar2 = (uint)uVar4;
    switch(uVar1) {
    case 3:
      uVar2 = (uint)pbVar5[2] << 0x10 ^ uVar2;
    case 2:
      uVar2 = uVar2 ^ (uint)pbVar5[1] << 8;
    case 1:
      uVar4 = (ulong)((*pbVar5 ^ uVar2) * 0x5bd1e995);
    case 0:
      uVar1 = ((uint)(uVar4 >> 0xd) & 0x7ffff ^ (uint)uVar4) * 0x5bd1e995;
      return uVar1 >> 0xf ^ uVar1;
    default:
      uVar4 = (ulong)(uVar2 * 0x5bd1e995 ^
                     ((uint)(*(int *)pbVar5 * 0x5bd1e995) >> 0x18 ^ *(int *)pbVar5 * 0x5bd1e995) *
                     0x5bd1e995);
      pbVar5 = pbVar5 + 4;
      uVar1 = (int)uVar3 - 4;
      uVar3 = (ulong)uVar1;
    }
  } while( true );
}

Assistant:

uint HashCoder::operator*(ArrayPtr<const byte> s) const {
  // murmur2 adapted from libc++ source code.
  //
  // TODO(perf): Use CityHash or FarmHash on 64-bit machines? They seem optimized for x86-64; what
  //   about ARM? Ask Vlad for advice.

  constexpr uint m = 0x5bd1e995;
  constexpr uint r = 24;
  uint h = s.size();
  const byte* data = s.begin();
  uint len = s.size();
  for (; len >= 4; data += 4, len -= 4) {
    uint k;
    memcpy(&k, data, sizeof(k));
    k *= m;
    k ^= k >> r;
    k *= m;
    h *= m;
    h ^= k;
  }
  switch (len) {
  case 3:
    h ^= data[2] << 16;
    // fallthrough
  case 2:
    h ^= data[1] << 8;
    // fallthrough
  case 1:
    h ^= data[0];
    h *= m;
  }
  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;
  return h;
}